

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_dcraw_external(CImg<unsigned_char> *this,char *filename)

{
  int iVar1;
  size_t sVar2;
  CImg<char> *pCVar3;
  char *pcVar4;
  FILE *pFVar5;
  char *pcVar6;
  CImgArgumentException *this_00;
  CImgIOException *pCVar7;
  char *pcVar8;
  ulong uVar9;
  CImg<char> local_b8;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> s_filename;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_dcraw_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar5 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar5 = fopen(filename,"rb");
  }
  if (pFVar5 == (FILE *)0x0) {
    pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar7,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  fclose(pFVar5);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  sVar2 = strlen(filename);
  CImg<char>::CImg(&local_b8,filename,(int)sVar2 + 1,1,1,1,false);
  pCVar3 = CImg<char>::_system_strescape(&local_b8);
  CImg<char>::CImg(&s_filename,pCVar3);
  if ((local_b8._is_shared == false) && (local_b8._data != (char *)0x0)) {
    operator_delete__(local_b8._data);
  }
  pcVar8 = command._data;
  uVar9 = (ulong)command._width;
  pcVar4 = cimg::dcraw_path((char *)0x0,false);
  snprintf(pcVar8,uVar9,"%s -w -4 -c \"%s\"",pcVar4,s_filename._data);
  pFVar5 = popen(command._data,"r");
  if (pFVar5 == (FILE *)0x0) {
    while( true ) {
      pcVar8 = filename_tmp._data;
      uVar9 = (ulong)filename_tmp._width;
      pcVar4 = cimg::temporary_path((char *)0x0,false);
      pcVar6 = cimg::filenamerand();
      snprintf(pcVar8,uVar9,"%s%c%s.ppm",pcVar4,0x2f,pcVar6);
      pFVar5 = fopen(filename_tmp._data,"rb");
      pcVar8 = command._data;
      if (pFVar5 == (FILE *)0x0) break;
      if (((_stdin != pFVar5) && (_stdout != pFVar5)) && (iVar1 = fclose(pFVar5), iVar1 != 0)) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
      }
    }
    pcVar6 = cimg::dcraw_path((char *)0x0,false);
    pcVar4 = s_filename._data;
    CImg<char>::string(&local_b8,filename_tmp._data,true,false);
    pCVar3 = CImg<char>::_system_strescape(&local_b8);
    snprintf(pcVar8,(ulong)command._width,"%s -w -4 -c \"%s\" > \"%s\"",pcVar6,pcVar4,pCVar3->_data)
    ;
    if ((local_b8._is_shared == false) && (local_b8._data != (char *)0x0)) {
      operator_delete__(local_b8._data);
    }
    pcVar8 = command._data;
    cimg::dcraw_path((char *)0x0,false);
    sVar2 = strlen(pcVar8);
    uVar9 = sVar2 & 0xffffffff;
    if (uVar9 != 0) {
      pcVar4 = (char *)operator_new__((ulong)((int)sVar2 + 0x10));
      strncpy(pcVar4,pcVar8,uVar9);
      builtin_strncpy(pcVar4 + uVar9," 2> /dev/null",0xe);
      system(pcVar4);
      operator_delete__(pcVar4);
    }
    pFVar5 = fopen(filename_tmp._data,"rb");
    if (pFVar5 == (FILE *)0x0) {
      pFVar5 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar5);
      pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar8 = "non-";
      if (this->_is_shared != false) {
        pcVar8 = "";
      }
      CImgIOException::CImgIOException
                (pCVar7,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_dcraw_external(): Failed to load file \'%s\' with external command \'dcraw\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar8,"unsigned char",filename);
      __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
    if (((_stdin != pFVar5) && (_stdout != pFVar5)) && (iVar1 = fclose(pFVar5), iVar1 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
    }
    _load_pnm(this,(FILE *)0x0,filename_tmp._data);
    remove(filename_tmp._data);
  }
  else {
    cimg::_exception_mode(0,false);
    cimg::_exception_mode(0,true);
    _load_pnm(this,(FILE *)pFVar5,(char *)0x0);
    pclose(pFVar5);
  }
  if ((s_filename._is_shared == false) && (s_filename._data != (char *)0x0)) {
    operator_delete__(s_filename._data);
  }
  if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
    operator_delete__(filename_tmp._data);
  }
  if ((command._is_shared == false) && (command._data != (char *)0x0)) {
    operator_delete__(command._data);
  }
  return this;
}

Assistant:

CImg<T>& load_dcraw_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_dcraw_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      cimg_snprintf(command,command._width,"%s -w -4 -c \"%s\"",
                    cimg::dcraw_path(),s_filename.data());
      file = popen(command,"r");
      if (file) {
        const unsigned int omode = cimg::exception_mode();
        cimg::exception_mode(0);
        try { load_pnm(file); } catch (...) {
          pclose(file);
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load_dcraw_external(): Failed to load file '%s' with external command 'dcraw'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.ppm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -w -4 -c \"%s\" > \"%s\"",
                    cimg::dcraw_path(),s_filename.data(),CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::dcraw_path());
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_dcraw_external(): Failed to load file '%s' with external command 'dcraw'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }